

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSocket.cc
# Opt level: O0

ssize_t __thiscall
ClientSocket::read_abi_cxx11_(ClientSocket *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ssize_t numBytes;
  char buffer [256];
  ClientSocket *this_local;
  string *message;
  
  std::__cxx11::string::string((string *)this);
  memset(&numBytes,0,0x100);
  while (sVar1 = recv(*(int *)CONCAT44(in_register_00000034,__fd),&numBytes,0x100,0x40), 0 < sVar1)
  {
    buffer[sVar1 + -8] = '\0';
    std::__cxx11::string::operator+=((string *)this,(char *)&numBytes);
  }
  return (ssize_t)this;
}

Assistant:

std::string ClientSocket::read()
{
  std::string message;

  char buffer[256] = { 0 };
  ssize_t numBytes = 0;

  while( ( numBytes = recv( _fileDescriptor, buffer, sizeof(buffer), MSG_DONTWAIT ) ) > 0 )
  {
    buffer[numBytes]  = 0;
    message          += buffer;
  }

  return message;
}